

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
dynet::LogSoftmax::backward_dev_impl<dynet::Device_CPU>
          (LogSoftmax *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  initializer_list<unsigned_int> x;
  uint uVar1;
  const_reference ppTVar2;
  runtime_error *this_00;
  uint *puVar3;
  reference pvVar4;
  reference pvVar5;
  Dim *in_RCX;
  vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *in_RDX;
  double __x;
  double __x_00;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  TVar6;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  TVar7;
  array<int,_2> bcast_1;
  array<int,_1> red_axis;
  array<int,_1> bcast;
  Tensor z;
  DefaultDevice *in_stack_fffffffffffff9e8;
  Tensor *in_stack_fffffffffffff9f0;
  Device *in_stack_fffffffffffff9f8;
  Tensor *in_stack_fffffffffffffa00;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0> *this_01;
  undefined4 in_stack_fffffffffffffa08;
  uint in_stack_fffffffffffffa0c;
  Tensor *in_stack_fffffffffffffa10;
  TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_0>
  *in_stack_fffffffffffffa18;
  size_type in_stack_fffffffffffffa20;
  TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>
  *in_stack_fffffffffffffaa8;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  *in_stack_fffffffffffffab0;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
  local_478 [224];
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
  local_398 [8];
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_390;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  local_380;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_2b8;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  local_2a8;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_298;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_288;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_240;
  TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
  local_230 [184];
  TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer> *local_178;
  TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
  local_168;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_150;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_140;
  undefined4 local_d4;
  undefined4 *local_d0;
  undefined8 local_c8;
  Dim *local_20;
  
  local_20 = in_RCX;
  ppTVar2 = std::vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>::operator[]
                      (in_RDX,0);
  uVar1 = Dim::cols(&(*ppTVar2)->d);
  if (uVar1 != 1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"LogSoftmax::backward not yet implemented for multiple columns");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_d4 = 1;
  local_d0 = &local_d4;
  local_c8 = 1;
  x._M_len = in_stack_fffffffffffffa20;
  x._M_array = (iterator)in_stack_fffffffffffffa18;
  Dim::Dim(&in_stack_fffffffffffffa10->d,x,in_stack_fffffffffffffa0c);
  Tensor::Tensor(in_stack_fffffffffffffa10,
                 (Dim *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                 (float *)in_stack_fffffffffffffa00,in_stack_fffffffffffff9f8,
                 (DeviceMempool)((ulong)in_stack_fffffffffffff9f0 >> 0x20));
  if (local_20->bd == 1) {
    local_140 = Tensor::t<1>(in_stack_fffffffffffffa00);
    local_150 = Tensor::t<1>(in_stack_fffffffffffffa00);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,0>::
    binaryExpr<dynet::FWeightedError,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
                *)in_stack_fffffffffffffa00,
               (TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *)
               in_stack_fffffffffffff9f8,(FWeightedError *)in_stack_fffffffffffff9f0);
    Eigen::
    TensorBase<Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
    ::sum((TensorBase<Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
           *)in_stack_fffffffffffffa00);
    local_178 = Tensor::t<0>(in_stack_fffffffffffff9f0);
    TVar6 = Eigen::
            TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_1>
            ::device<Eigen::DefaultDevice>
                      ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_1>
                        *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    local_168 = TVar6;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,0,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_0,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                 *)in_stack_fffffffffffffa00,
                (TensorReductionOp<Eigen::internal::SumReducer<float>,_const_Eigen::DimensionList<long,_1UL>,_const_Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::MakePointer>
                 *)in_stack_fffffffffffff9f8);
    uVar1 = Dim::rows(local_20);
    puVar3 = (uint *)std::array<int,_1UL>::operator[]
                               ((array<int,_1UL> *)in_stack_fffffffffffff9f0,
                                (size_type)in_stack_fffffffffffff9e8);
    *puVar3 = uVar1;
    local_240 = Tensor::t<1>(in_stack_fffffffffffffa00);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
    ::exp(local_230,__x);
    local_288 = Tensor::t<1>(in_stack_fffffffffffffa00);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,0>::
    broadcast<std::array<int,1ul>>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_0>
                *)in_stack_fffffffffffffa00,(array<int,_1UL> *)in_stack_fffffffffffff9f8);
    Eigen::
    TensorBase<Eigen::TensorBroadcastingOp<const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
    ::operator-((TensorBase<Eigen::TensorBroadcastingOp<const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
                 *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08));
    Eigen::
    TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>const>,0>
    ::operator*((TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
                 *)in_stack_fffffffffffffa18,
                (TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>
                 *)in_stack_fffffffffffffa10);
    local_298 = Tensor::t<1>(in_stack_fffffffffffffa00);
    Eigen::
    TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>const>const,Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::TensorBroadcastingOp<std::array<int,1ul>const,Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>const>const>const>,0>
    ::operator+(in_stack_fffffffffffffa18,
                (TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> *)
                in_stack_fffffffffffffa10);
    local_2b8 = Tensor::t<1>(in_stack_fffffffffffffa00);
    local_2a8 = Eigen::
                TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
                ::device<Eigen::DefaultDevice>
                          ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
                            *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator+=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                  *)TVar6.m_device,
                 (TensorCwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>
                  *)TVar6.m_expression);
  }
  else {
    pvVar4 = std::array<int,_1UL>::operator[]
                       ((array<int,_1UL> *)in_stack_fffffffffffff9f0,
                        (size_type)in_stack_fffffffffffff9e8);
    *pvVar4 = 0;
    Tensor::tb<1>(in_stack_fffffffffffffa10);
    Tensor::tb<1>(in_stack_fffffffffffffa10);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
    binaryExpr<dynet::FWeightedError,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
                *)in_stack_fffffffffffffa00,
               (TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)
               in_stack_fffffffffffff9f8,(FWeightedError *)in_stack_fffffffffffff9f0);
    Eigen::
    TensorBase<Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>const>,0>
    ::sum<std::array<int,1ul>>
              ((TensorBase<Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
                *)in_stack_fffffffffffffa00,(array<int,_1UL> *)in_stack_fffffffffffff9f8);
    local_390 = Tensor::tb<0>(in_stack_fffffffffffff9f0);
    TVar7 = Eigen::
            TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
            ::device<Eigen::DefaultDevice>
                      ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_1>
                        *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    local_380 = TVar7;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_Eigen::DefaultDevice>
                 *)in_stack_fffffffffffffa00,
                (TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorCwiseBinaryOp<dynet::FWeightedError,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_Eigen::MakePointer>
                 *)in_stack_fffffffffffff9f8);
    uVar1 = Dim::rows(local_20);
    this_01 = local_398;
    puVar3 = (uint *)std::array<int,_2UL>::operator[]
                               ((array<int,_2UL> *)in_stack_fffffffffffff9f0,
                                (size_type)in_stack_fffffffffffff9e8);
    *puVar3 = uVar1;
    pvVar5 = std::array<int,_2UL>::operator[]
                       ((array<int,_2UL> *)in_stack_fffffffffffff9f0,
                        (size_type)in_stack_fffffffffffff9e8);
    *pvVar5 = 1;
    Tensor::tb<1>((Tensor *)TVar7.m_expression);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_0>
    ::exp(local_478,__x_00);
    Tensor::tb<1>((Tensor *)TVar7.m_expression);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,0>::
    broadcast<std::array<int,2ul>>(this_01,(array<int,_2UL> *)in_stack_fffffffffffff9f8);
    Eigen::
    TensorBase<Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
    ::operator-((TensorBase<Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
                 *)CONCAT44(uVar1,in_stack_fffffffffffffa08));
    Eigen::
    TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>const>,0>
    ::operator*((TensorBase<Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_0>
                 *)TVar7.m_device,
                (TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>
                 *)TVar7.m_expression);
    Tensor::tb<1>((Tensor *)TVar7.m_expression);
    Eigen::
    TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>const>const,Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::TensorBroadcastingOp<std::array<int,2ul>const,Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>const>const>const>,0>
    ::operator+((TensorBase<Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_exp_op<float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorCwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>_>,_0>
                 *)TVar7.m_device,
                (TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)
                TVar7.m_expression);
    Tensor::tb<1>((Tensor *)TVar7.m_expression);
    Eigen::TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
    ::device<Eigen::DefaultDevice>
              ((TensorBase<Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_1>
                *)in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator+=(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  }
  Tensor::~Tensor((Tensor *)0xa1ca48);
  return;
}

Assistant:

void LogSoftmax::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  if (xs[0]->d.cols() != 1) 
    throw std::runtime_error("LogSoftmax::backward not yet implemented for multiple columns");
  Tensor z(Dim({1},fx.d.bd), (float*)aux_mem, fx.device, DeviceMempool::FXS);
  if(fx.d.bd == 1) {
    z.t<0>().device(*dev.edevice) = fx.t<1>().binaryExpr(dEdf.t<1>(), FWeightedError()).sum();
    Eigen::array<int, 1> bcast; bcast[0] = fx.d.rows();
    dEdxi.t<1>().device(*dev.edevice) += fx.t<1>().exp() * -z.t<1>().broadcast(bcast) + dEdf.t<1>();
  } else {
    Eigen::array<int, 1> red_axis; red_axis[0] = 0;
    z.tb<0>().device(*dev.edevice) = (fx.tb<1>().binaryExpr(dEdf.tb<1>(), FWeightedError())).sum(red_axis);
    Eigen::array<int, 2> bcast; bcast[0] = fx.d.rows(); bcast[1] = 1;
    dEdxi.tb<1>().device(*dev.edevice) += fx.tb<1>().exp() * -z.tb<1>().broadcast(bcast) + dEdf.tb<1>();
  }
}